

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stitching.cpp
# Opt level: O2

int print_stitched_file(map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
                        *a_nodes_map,
                       map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
                       *a_lines_map,
                       map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
                       *b_nodes_map,
                       map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
                       *b_lines_map,string *outfile_path,string *char_len_over)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  int iVar5;
  _Rb_tree_header *p_Var6;
  _Self __tmp;
  ofstream geo_file;
  
  std::
  _Rb_tree<int,std::pair<int_const,node>,std::_Select1st<std::pair<int_const,node>>,std::less<int>,std::allocator<std::pair<int_const,node>>>
  ::_M_insert_range_unique<std::_Rb_tree_iterator<std::pair<int_const,node>>>
            ((_Rb_tree<int,std::pair<int_const,node>,std::_Select1st<std::pair<int_const,node>>,std::less<int>,std::allocator<std::pair<int_const,node>>>
              *)a_nodes_map,(b_nodes_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_iterator<std::pair<const_int,_node>_>)
             &(b_nodes_map->_M_t)._M_impl.super__Rb_tree_header);
  std::
  _Rb_tree<int,std::pair<int_const,stitch::line>,std::_Select1st<std::pair<int_const,stitch::line>>,std::less<int>,std::allocator<std::pair<int_const,stitch::line>>>
  ::_M_insert_range_unique<std::_Rb_tree_iterator<std::pair<int_const,stitch::line>>>
            ((_Rb_tree<int,std::pair<int_const,stitch::line>,std::_Select1st<std::pair<int_const,stitch::line>>,std::less<int>,std::allocator<std::pair<int_const,stitch::line>>>
              *)a_lines_map,(b_lines_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_iterator<std::pair<const_int,_stitch::line>_>)
             &(b_lines_map->_M_t)._M_impl.super__Rb_tree_header);
  std::ofstream::ofstream((string *)&geo_file);
  std::ofstream::open((string *)&geo_file,(_Ios_Openmode)outfile_path);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cout,"Unable to create new meshfile.");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar5 = 1;
  }
  else {
    std::operator<<((ostream *)&geo_file,
                    "//========================== Border Nodes ==========================\n");
    p_Var4 = (a_nodes_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar2 = std::operator==(char_len_over,"");
    p_Var6 = &(a_nodes_map->_M_t)._M_impl.super__Rb_tree_header;
    if (bVar2) {
      for (; (_Rb_tree_header *)p_Var4 != p_Var6;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        poVar3 = std::operator<<((ostream *)&geo_file,"Point(");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,p_Var4[1]._M_color);
        std::operator<<(poVar3,") = {");
        poVar3 = std::ostream::_M_insert<double>((double)p_Var4[1]._M_parent);
        std::operator<<(poVar3,", ");
        poVar3 = std::ostream::_M_insert<double>((double)p_Var4[1]._M_left);
        std::operator<<(poVar3,", ");
        poVar3 = std::ostream::_M_insert<double>((double)p_Var4[1]._M_right);
        std::operator<<(poVar3,", ");
        poVar3 = std::ostream::_M_insert<double>(*(double *)(p_Var4 + 2));
        std::operator<<(poVar3,"};\n");
      }
    }
    else {
      for (; (_Rb_tree_header *)p_Var4 != p_Var6;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        poVar3 = std::operator<<((ostream *)&geo_file,"Point(");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,p_Var4[1]._M_color);
        std::operator<<(poVar3,") = {");
        poVar3 = std::ostream::_M_insert<double>((double)p_Var4[1]._M_parent);
        std::operator<<(poVar3,", ");
        poVar3 = std::ostream::_M_insert<double>((double)p_Var4[1]._M_left);
        std::operator<<(poVar3,", ");
        poVar3 = std::ostream::_M_insert<double>((double)p_Var4[1]._M_right);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = std::operator<<(poVar3,(string *)char_len_over);
        std::operator<<(poVar3,"};\n");
      }
    }
    std::operator<<((ostream *)&geo_file,
                    "//========================== Shape Faces ===========================\n");
    for (p_Var4 = (a_lines_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(a_lines_map->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      poVar3 = std::operator<<((ostream *)&geo_file,"Line(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,p_Var4[1]._M_color);
      poVar3 = std::operator<<(poVar3,") = {");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)&p_Var4[1].field_0x4);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)&p_Var4[1]._M_parent);
      std::operator<<(poVar3,"};\n");
    }
    std::operator<<((ostream *)&geo_file,
                    "//============================== END ================================\n");
    iVar5 = 0;
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&geo_file);
  return iVar5;
}

Assistant:

int print_stitched_file(map<int, node> &a_nodes_map,
                        map<int, stitch::line> &a_lines_map,
                        map<int, node> &b_nodes_map,
                        map<int, stitch::line> &b_lines_map,
                        const string &outfile_path,
                        const string &char_len_over) {
  a_nodes_map.insert(b_nodes_map.begin(), b_nodes_map.end());
  a_lines_map.insert(b_lines_map.begin(), b_lines_map.end());
  ofstream geo_file;
  geo_file.open(outfile_path);
  if (geo_file.is_open()) {
    geo_file << "//========================== Border Nodes ==========================\n";
    auto i = a_nodes_map.begin();
    if (char_len_over == "") {
      while (i != a_nodes_map.end()) {
        geo_file << "Point(" << i->first << ") = {" << i->second.x << ", "
                 << i->second.y << ", " << i->second.z << ", "
                 << i->second.characteristic_length << "};\n";
        i++;
      }
    } else {
      while (i != a_nodes_map.end()) {
        geo_file << "Point(" << i->first << ") = {" << i->second.x << ", "
                 << i->second.y << ", " << i->second.z << ", "
                 << char_len_over << "};\n";
        i++;
      }
    }
    geo_file << "//========================== Shape Faces ===========================\n";
    auto j = a_lines_map.begin();
    while (j != a_lines_map.end()) {
      geo_file << "Line(" << j->first << ") = {" << j->second.first << ", "
               << j->second.second << "};\n";
      j++;
    }
    geo_file << "//============================== END ================================\n";
    geo_file.close();
    return 0;
  } else {
    cout << "Unable to create new meshfile." << endl;
    return 1;
  }
}